

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::
exception<char_const(&)[22],unsigned_char&,char_const(&)[6],CylHead&,char_const(&)[9],int&>
          (exception *this,char (*args) [22],uchar *args_1,char (*args_2) [6],CylHead *args_3,
          char (*args_4) [9],int *args_5)

{
  int *in_stack_ffffffffffffff80;
  string local_58;
  char (*local_38) [9];
  char (*args_local_4) [9];
  CylHead *args_local_3;
  char (*args_local_2) [6];
  uchar *args_local_1;
  char (*args_local) [22];
  exception *this_local;
  
  local_38 = args_4;
  args_local_4 = (char (*) [9])args_3;
  args_local_3 = (CylHead *)args_2;
  args_local_2 = (char (*) [6])args_1;
  args_local_1 = (uchar *)args;
  args_local = (char (*) [22])this;
  make_string<char_const(&)[22],unsigned_char&,char_const(&)[6],CylHead&,char_const(&)[9],int&>
            (&local_58,(util *)args,(char (*) [22])args_1,(uchar *)args_2,(char (*) [6])args_3,
             (CylHead *)args_4,(char (*) [9])args_5,in_stack_ffffffffffffff80);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}